

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_vocab.c
# Opt level: O1

uint32_t HashVocab_id(HashVocab vocab,char *word)

{
  ProbingVocabularyEntry_T *pPVar1;
  uint32_t uVar2;
  size_t len;
  uint64_t uVar3;
  ulong uVar4;
  ProbingVocabularyEntry_T *pPVar5;
  byte bVar6;
  uint64_t uVar7;
  
  len = strlen(word);
  uVar3 = MurmurHash64(word,len,0);
  pPVar1 = (vocab->tb).begin_;
  uVar4 = uVar3 % (vocab->tb).buckets_;
  uVar7 = pPVar1[uVar4].key;
  uVar2 = 0xffffffff;
  if (uVar7 != kInvalidHash) {
    pPVar5 = pPVar1 + uVar4;
    bVar6 = 0;
    while (uVar7 != uVar3) {
      pPVar5 = pPVar5 + 1;
      if ((pPVar5 == (vocab->tb).end_) && (bVar6 = bVar6 + 1, pPVar5 = pPVar1, 1 < bVar6)) {
        return 0xffffffff;
      }
      uVar7 = pPVar5->key;
      if (uVar7 == kInvalidHash) {
        return 0xffffffff;
      }
    }
    uVar2 = pPVar5->value;
  }
  return uVar2;
}

Assistant:

uint32_t HashVocab_id(const HashVocab vocab, const char* word){
    uint64_t hashed = hash(word);
    //if (hashed == kUnknownHash || hashed == kUnknownCapHash) {
    //    return 0;
    //}
    ProbingVocabularyEntry_T *slot = HashTable_ideal(&vocab->tb, hashed);
    uint8_t check_dead_loop = 0;
    while (1) {
        if (slot->key == kInvalidHash) {
            //printf("hash:%zu\n", hashed);
            //printf("cannot find\n");
            return -1;//cannot find
        }
        if (slot->key == hashed) {
            return slot->value;
        }
        if ((++slot) == vocab->tb.end_) {
            check_dead_loop++;
            if (check_dead_loop >= 2) {
                //printf("hash:%zu\n", hashed);
                //printf("cannot find dead loop\n");
                return -1;
            }
            slot = vocab->tb.begin_;
        }
    }
    return -1;
}